

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O2

roaring64_bitmap_t * roaring64_bitmap_create(void)

{
  roaring64_bitmap_t *art;
  
  art = (roaring64_bitmap_t *)roaring_malloc(0xb8);
  art_init_cleared((art_t *)art);
  art->flags = '\0';
  art->first_free = 0;
  art->capacity = 0;
  art->containers = (container_t **)0x0;
  return art;
}

Assistant:

roaring64_bitmap_t *roaring64_bitmap_create(void) {
    roaring64_bitmap_t *r =
        (roaring64_bitmap_t *)roaring_malloc(sizeof(roaring64_bitmap_t));
    art_init_cleared(&r->art);
    r->flags = 0;
    r->capacity = 0;
    r->first_free = 0;
    r->containers = NULL;
    return r;
}